

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv.hpp
# Opt level: O0

uint64_t pstore::fnv_details::append(uint8_t v,uint64_t hval)

{
  uint64_t hval_local;
  uint8_t v_local;
  
  return (v ^ hval) * 0x1b3 + ((v ^ hval) << 0x28);
}

Assistant:

inline std::uint64_t append (std::uint8_t const v, std::uint64_t hval) noexcept {
            // xor the bottom with the current octet
            hval ^= static_cast<std::uint64_t> (v);

// multiply by the 64 bit FNV magic prime mod 2^64
#ifdef NO_FNV_GCC_OPTIMIZATION
            hval *= fnv_64_prime;
#else
            hval += (hval << 1U) + (hval << 4U) + (hval << 5U) + (hval << 7U) + (hval << 8U) +
                    (hval << 40U);
#endif
            return hval;
        }